

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssertTest.cpp
# Opt level: O2

void __thiscall
CppAssertTest_formatStatementAssertion_Test::TestBody
          (CppAssertTest_formatStatementAssertion_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  string local_30;
  
  cppassert::DefaultFormatter::formatStatementFailureMessage_abi_cxx11_
            (&local_30,(DefaultFormatter *)(this->super_CppAssertTest).cppAssert_,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  local_50.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","formatStatementCounter_",(int *)&local_50,
             &(this->super_CppAssertTest).formatStatementCounter_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/CppAssertTest.cpp"
               ,0x9f,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CppAssertTest, formatStatementAssertion)
{
    cppAssert_->formatStatementFailureMessage(nullptr);
    EXPECT_EQ(1, formatStatementCounter_);
}